

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O0

int archive_read_support_format_warc(archive *_a)

{
  int iVar1;
  void *__s;
  int magic_test;
  int r;
  warc_s *w;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_warc");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    __s = malloc(0x48);
    if (__s == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate warc data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      memset(__s,0,0x48);
      _a_local._4_4_ =
           __archive_read_register_format
                     ((archive_read *)_a,__s,"warc",_warc_bid,
                      (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,_warc_rdhdr,_warc_read,
                      _warc_skip,(_func_int64_t_archive_read_ptr_int64_t_int *)0x0,_warc_cleanup,
                      (_func_int_archive_read_ptr *)0x0,(_func_int_archive_read_ptr *)0x0);
      if (_a_local._4_4_ == 0) {
        _a_local._4_4_ = 0;
      }
      else {
        free(__s);
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_warc(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct warc_s *w;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_warc");

	if ((w = malloc(sizeof(*w))) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate warc data");
		return (ARCHIVE_FATAL);
	}
	memset(w, 0, sizeof(*w));

	r = __archive_read_register_format(
		a, w, "warc",
		_warc_bid, NULL, _warc_rdhdr, _warc_read,
		_warc_skip, NULL, _warc_cleanup, NULL, NULL);

	if (r != ARCHIVE_OK) {
		free(w);
		return (r);
	}
	return (ARCHIVE_OK);
}